

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::SubGridIntersector1Pluecker<8,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  float fVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  byte bVar36;
  byte bVar37;
  long lVar38;
  byte bVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  float fVar53;
  float fVar87;
  float fVar88;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar89;
  undefined1 auVar59 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined4 uVar101;
  float fVar102;
  float fVar105;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined8 uVar112;
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [32];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 in_XMM27 [16];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong *local_27d0;
  undefined1 local_27c1;
  RayHit *local_27c0;
  RayQueryContext *local_27b8;
  RTCIntersectArguments *local_27b0;
  ulong local_27a8;
  ulong local_27a0;
  ulong local_2798;
  ulong local_2790;
  ulong local_2788;
  ulong local_2780;
  ulong local_2778;
  int local_276c;
  ulong local_2768;
  ulong local_2760;
  ulong local_2758;
  ulong local_2750;
  ulong local_2748;
  ulong local_2740;
  ulong local_2738;
  long local_2730;
  long local_2728;
  long local_2720;
  ulong local_2718;
  RTCFilterFunctionNArguments local_2710;
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float local_26b0;
  float local_26ac;
  float local_26a8;
  undefined4 local_26a4;
  undefined4 local_26a0;
  undefined4 local_269c;
  undefined4 local_2698;
  uint local_2694;
  uint local_2690;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 *local_2580;
  byte local_2578;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  uint uStack_24e4;
  float local_24e0 [4];
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  uint uStack_24c4;
  float local_24c0 [4];
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar56 [16];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27d0 = local_2390;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar54._8_4_ = 0x7fffffff;
    auVar54._0_8_ = 0x7fffffff7fffffff;
    auVar54._12_4_ = 0x7fffffff;
    auVar54 = vandps_avx512vl((undefined1  [16])aVar3,auVar54);
    auVar55._8_4_ = 0x219392ef;
    auVar55._0_8_ = 0x219392ef219392ef;
    auVar55._12_4_ = 0x219392ef;
    uVar42 = vcmpps_avx512vl(auVar54,auVar55,1);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar54 = vdivps_avx(auVar109,(undefined1  [16])aVar3);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar15 = (bool)((byte)uVar42 & 1);
    auVar56._0_4_ = (uint)bVar15 * auVar55._0_4_ | (uint)!bVar15 * auVar54._0_4_;
    bVar15 = (bool)((byte)(uVar42 >> 1) & 1);
    auVar56._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar54._4_4_;
    bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
    auVar56._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar54._8_4_;
    bVar15 = (bool)((byte)(uVar42 >> 3) & 1);
    auVar56._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar54._12_4_;
    auVar57._8_4_ = 0x3f7ffffa;
    auVar57._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar57._12_4_ = 0x3f7ffffa;
    auVar57 = vmulps_avx512vl(auVar56,auVar57);
    auVar58._8_4_ = 0x3f800003;
    auVar58._0_8_ = 0x3f8000033f800003;
    auVar58._12_4_ = 0x3f800003;
    auVar58 = vmulps_avx512vl(auVar56,auVar58);
    uVar101 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2680._4_4_ = uVar101;
    local_2680._0_4_ = uVar101;
    local_2680._8_4_ = uVar101;
    local_2680._12_4_ = uVar101;
    local_2680._16_4_ = uVar101;
    local_2680._20_4_ = uVar101;
    local_2680._24_4_ = uVar101;
    local_2680._28_4_ = uVar101;
    uVar101 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar101;
    local_2400._0_4_ = uVar101;
    local_2400._8_4_ = uVar101;
    local_2400._12_4_ = uVar101;
    local_2400._16_4_ = uVar101;
    local_2400._20_4_ = uVar101;
    local_2400._24_4_ = uVar101;
    local_2400._28_4_ = uVar101;
    auVar121 = ZEXT3264(local_2400);
    uVar101 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar101;
    local_2420._0_4_ = uVar101;
    local_2420._8_4_ = uVar101;
    local_2420._12_4_ = uVar101;
    local_2420._16_4_ = uVar101;
    local_2420._20_4_ = uVar101;
    local_2420._24_4_ = uVar101;
    local_2420._28_4_ = uVar101;
    auVar124 = ZEXT3264(local_2420);
    local_2398[0] = 0;
    fVar105 = auVar57._0_4_;
    auVar54 = vmovshdup_avx(auVar57);
    uVar112 = auVar54._0_8_;
    register0x00001508 = uVar112;
    local_2640 = uVar112;
    register0x00001510 = uVar112;
    register0x00001518 = uVar112;
    auVar55 = vshufpd_avx(auVar57,auVar57,1);
    auVar60._8_4_ = 2;
    auVar60._0_8_ = 0x200000002;
    auVar60._12_4_ = 2;
    auVar60._16_4_ = 2;
    auVar60._20_4_ = 2;
    auVar60._24_4_ = 2;
    auVar60._28_4_ = 2;
    _local_26e0 = vpermps_avx2(auVar60,ZEXT1632(auVar57));
    fVar93 = auVar58._0_4_;
    auVar61._8_4_ = 1;
    auVar61._0_8_ = 0x100000001;
    auVar61._12_4_ = 1;
    auVar61._16_4_ = 1;
    auVar61._20_4_ = 1;
    auVar61._24_4_ = 1;
    auVar61._28_4_ = 1;
    local_2460 = vpermps_avx2(auVar61,ZEXT1632(auVar58));
    auVar134 = ZEXT3264(local_2460);
    local_2480 = vpermps_avx2(auVar60,ZEXT1632(auVar58));
    auVar136 = ZEXT3264(local_2480);
    auVar117 = ZEXT3264(local_2680);
    uVar42 = (ulong)(fVar105 < 0.0) << 5;
    auVar114 = ZEXT3264(_local_26e0);
    uVar45 = (ulong)(auVar54._0_4_ < 0.0) << 5 | 0x40;
    auVar115 = ZEXT3264(_local_2640);
    uVar47 = (ulong)(auVar55._0_4_ < 0.0) << 5 | 0x80;
    uVar48 = uVar42 ^ 0x20;
    uVar49 = uVar45 ^ 0x20;
    uVar50 = uVar47 ^ 0x20;
    uVar101 = auVar59._0_4_;
    local_24a0._4_4_ = uVar101;
    local_24a0._0_4_ = uVar101;
    local_24a0._8_4_ = uVar101;
    local_24a0._12_4_ = uVar101;
    local_24a0._16_4_ = uVar101;
    local_24a0._20_4_ = uVar101;
    local_24a0._24_4_ = uVar101;
    local_24a0._28_4_ = uVar101;
    auVar125 = ZEXT3264(local_24a0);
    auVar60 = vbroadcastss_avx512vl(auVar16);
    auVar137 = ZEXT3264(auVar60);
    local_2738 = (ulong)(((uint)(fVar105 < 0.0) << 5) >> 2);
    local_2740 = uVar48 >> 2;
    local_2748 = uVar45 >> 2;
    local_2750 = uVar49 >> 2;
    local_2758 = uVar47 >> 2;
    local_2760 = uVar50 >> 2;
    auVar60 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar138 = ZEXT3264(auVar60);
    auVar60 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar139 = ZEXT3264(auVar60);
    local_2620 = fVar105;
    fStack_261c = fVar105;
    fStack_2618 = fVar105;
    fStack_2614 = fVar105;
    fStack_2610 = fVar105;
    fStack_260c = fVar105;
    fStack_2608 = fVar105;
    fStack_2604 = fVar105;
    local_2440 = fVar93;
    fStack_243c = fVar93;
    fStack_2438 = fVar93;
    fStack_2434 = fVar93;
    fStack_2430 = fVar93;
    fStack_242c = fVar93;
    fStack_2428 = fVar93;
    fStack_2424 = fVar93;
    fVar102 = fVar105;
    fVar53 = fVar105;
    fVar87 = fVar105;
    fVar88 = fVar105;
    fVar89 = fVar105;
    fVar90 = fVar105;
    fVar91 = fVar93;
    fVar92 = fVar93;
    fVar129 = fVar93;
    fVar130 = fVar93;
    fVar131 = fVar93;
    fVar132 = fVar93;
    local_27c0 = ray;
    local_27b8 = context;
    local_27a8 = uVar50;
    local_27a0 = uVar49;
    local_2798 = uVar48;
    local_2790 = uVar47;
    local_2788 = uVar45;
    local_2780 = uVar42;
    do {
      pfVar2 = (float *)(local_27d0 + -1);
      local_27d0 = local_27d0 + -2;
      if (*pfVar2 <= (ray->super_RayK<1>).tfar) {
        uVar43 = *local_27d0;
        while (local_23e0 = auVar137._0_32_, (uVar43 & 8) == 0) {
          auVar60 = vsubps_avx(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar42),auVar117._0_32_);
          auVar68._4_4_ = fVar102 * auVar60._4_4_;
          auVar68._0_4_ = fVar105 * auVar60._0_4_;
          auVar68._8_4_ = fVar53 * auVar60._8_4_;
          auVar68._12_4_ = fVar87 * auVar60._12_4_;
          auVar68._16_4_ = fVar88 * auVar60._16_4_;
          auVar68._20_4_ = fVar89 * auVar60._20_4_;
          auVar68._24_4_ = fVar90 * auVar60._24_4_;
          auVar68._28_4_ = auVar60._28_4_;
          auVar60 = vsubps_avx(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar45),auVar121._0_32_);
          auVar62._4_4_ = auVar115._4_4_ * auVar60._4_4_;
          auVar62._0_4_ = auVar115._0_4_ * auVar60._0_4_;
          auVar62._8_4_ = auVar115._8_4_ * auVar60._8_4_;
          auVar62._12_4_ = auVar115._12_4_ * auVar60._12_4_;
          auVar62._16_4_ = auVar115._16_4_ * auVar60._16_4_;
          auVar62._20_4_ = auVar115._20_4_ * auVar60._20_4_;
          auVar62._24_4_ = auVar115._24_4_ * auVar60._24_4_;
          auVar62._28_4_ = auVar60._28_4_;
          auVar60 = vmaxps_avx(auVar68,auVar62);
          auVar61 = vsubps_avx(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar47),auVar124._0_32_);
          auVar63._4_4_ = auVar114._4_4_ * auVar61._4_4_;
          auVar63._0_4_ = auVar114._0_4_ * auVar61._0_4_;
          auVar63._8_4_ = auVar114._8_4_ * auVar61._8_4_;
          auVar63._12_4_ = auVar114._12_4_ * auVar61._12_4_;
          auVar63._16_4_ = auVar114._16_4_ * auVar61._16_4_;
          auVar63._20_4_ = auVar114._20_4_ * auVar61._20_4_;
          auVar63._24_4_ = auVar114._24_4_ * auVar61._24_4_;
          auVar63._28_4_ = auVar61._28_4_;
          auVar61 = vsubps_avx(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar48),auVar117._0_32_);
          auVar66._4_4_ = fVar91 * auVar61._4_4_;
          auVar66._0_4_ = fVar93 * auVar61._0_4_;
          auVar66._8_4_ = fVar92 * auVar61._8_4_;
          auVar66._12_4_ = fVar129 * auVar61._12_4_;
          auVar66._16_4_ = fVar130 * auVar61._16_4_;
          auVar66._20_4_ = fVar131 * auVar61._20_4_;
          auVar66._24_4_ = fVar132 * auVar61._24_4_;
          auVar66._28_4_ = auVar61._28_4_;
          auVar61 = vsubps_avx(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar49),auVar121._0_32_);
          auVar69._4_4_ = auVar134._4_4_ * auVar61._4_4_;
          auVar69._0_4_ = auVar134._0_4_ * auVar61._0_4_;
          auVar69._8_4_ = auVar134._8_4_ * auVar61._8_4_;
          auVar69._12_4_ = auVar134._12_4_ * auVar61._12_4_;
          auVar69._16_4_ = auVar134._16_4_ * auVar61._16_4_;
          auVar69._20_4_ = auVar134._20_4_ * auVar61._20_4_;
          auVar69._24_4_ = auVar134._24_4_ * auVar61._24_4_;
          auVar69._28_4_ = auVar61._28_4_;
          auVar68 = vminps_avx(auVar66,auVar69);
          auVar61 = vsubps_avx(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar50),auVar124._0_32_);
          auVar65._4_4_ = auVar136._4_4_ * auVar61._4_4_;
          auVar65._0_4_ = auVar136._0_4_ * auVar61._0_4_;
          auVar65._8_4_ = auVar136._8_4_ * auVar61._8_4_;
          auVar65._12_4_ = auVar136._12_4_ * auVar61._12_4_;
          auVar65._16_4_ = auVar136._16_4_ * auVar61._16_4_;
          auVar65._20_4_ = auVar136._20_4_ * auVar61._20_4_;
          auVar65._24_4_ = auVar136._24_4_ * auVar61._24_4_;
          auVar65._28_4_ = auVar61._28_4_;
          auVar61 = vmaxps_avx(auVar63,auVar125._0_32_);
          auVar60 = vmaxps_avx(auVar60,auVar61);
          auVar61 = vminps_avx512vl(auVar65,local_23e0);
          auVar61 = vminps_avx(auVar68,auVar61);
          uVar18 = vcmpps_avx512vl(auVar60,auVar61,2);
          bVar36 = (byte)uVar18;
          if (bVar36 == 0) goto LAB_01f39d9d;
          auVar61 = *(undefined1 (*) [32])(uVar43 & 0xfffffffffffffff0);
          auVar68 = ((undefined1 (*) [32])(uVar43 & 0xfffffffffffffff0))[1];
          auVar62 = vmovdqa64_avx512vl(auVar138._0_32_);
          auVar62 = vpternlogd_avx512vl(auVar62,auVar60,auVar139._0_32_,0xf8);
          auVar63 = vpcompressd_avx512vl(auVar62);
          auVar64._0_4_ =
               (uint)(bVar36 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar62._0_4_;
          bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar64._4_4_ = (uint)bVar15 * auVar63._4_4_ | (uint)!bVar15 * auVar62._4_4_;
          bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar64._8_4_ = (uint)bVar15 * auVar63._8_4_ | (uint)!bVar15 * auVar62._8_4_;
          bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar64._12_4_ = (uint)bVar15 * auVar63._12_4_ | (uint)!bVar15 * auVar62._12_4_;
          bVar15 = (bool)((byte)(uVar18 >> 4) & 1);
          auVar64._16_4_ = (uint)bVar15 * auVar63._16_4_ | (uint)!bVar15 * auVar62._16_4_;
          bVar15 = (bool)((byte)(uVar18 >> 5) & 1);
          auVar64._20_4_ = (uint)bVar15 * auVar63._20_4_ | (uint)!bVar15 * auVar62._20_4_;
          bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar64._24_4_ = (uint)bVar15 * auVar63._24_4_ | (uint)!bVar15 * auVar62._24_4_;
          bVar15 = SUB81(uVar18 >> 7,0);
          auVar64._28_4_ = (uint)bVar15 * auVar63._28_4_ | (uint)!bVar15 * auVar62._28_4_;
          auVar62 = vpermt2q_avx512vl(auVar61,auVar64,auVar68);
          uVar43 = auVar62._0_8_;
          bVar36 = bVar36 - 1 & bVar36;
          if (bVar36 != 0) {
            auVar62 = vpshufd_avx2(auVar64,0x55);
            vpermt2q_avx512vl(auVar61,auVar62,auVar68);
            auVar63 = vpminsd_avx2(auVar64,auVar62);
            auVar62 = vpmaxsd_avx2(auVar64,auVar62);
            bVar36 = bVar36 - 1 & bVar36;
            if (bVar36 == 0) {
              auVar63 = vpermi2q_avx512vl(auVar63,auVar61,auVar68);
              uVar43 = auVar63._0_8_;
              auVar61 = vpermt2q_avx512vl(auVar61,auVar62,auVar68);
              *local_27d0 = auVar61._0_8_;
              auVar60 = vpermd_avx2(auVar62,auVar60);
              *(int *)(local_27d0 + 1) = auVar60._0_4_;
              local_27d0 = local_27d0 + 2;
              auVar114 = ZEXT3264(_local_26e0);
            }
            else {
              auVar69 = vpshufd_avx2(auVar64,0xaa);
              vpermt2q_avx512vl(auVar61,auVar69,auVar68);
              auVar66 = vpminsd_avx2(auVar63,auVar69);
              auVar63 = vpmaxsd_avx2(auVar63,auVar69);
              auVar69 = vpminsd_avx2(auVar62,auVar63);
              auVar62 = vpmaxsd_avx2(auVar62,auVar63);
              bVar36 = bVar36 - 1 & bVar36;
              if (bVar36 == 0) {
                auVar63 = vpermi2q_avx512vl(auVar66,auVar61,auVar68);
                uVar43 = auVar63._0_8_;
                auVar63 = vpermt2q_avx512vl(auVar61,auVar62,auVar68);
                *local_27d0 = auVar63._0_8_;
                auVar62 = vpermd_avx2(auVar62,auVar60);
                *(int *)(local_27d0 + 1) = auVar62._0_4_;
                auVar61 = vpermt2q_avx512vl(auVar61,auVar69,auVar68);
                local_27d0[2] = auVar61._0_8_;
                auVar60 = vpermd_avx2(auVar69,auVar60);
                *(int *)(local_27d0 + 3) = auVar60._0_4_;
                local_27d0 = local_27d0 + 4;
                auVar117 = ZEXT3264(local_2680);
                auVar115 = ZEXT3264(auVar115._0_32_);
                auVar114 = ZEXT3264(_local_26e0);
              }
              else {
                auVar63 = vpshufd_avx2(auVar64,0xff);
                vpermt2q_avx512vl(auVar61,auVar63,auVar68);
                auVar65 = vpminsd_avx2(auVar66,auVar63);
                auVar63 = vpmaxsd_avx2(auVar66,auVar63);
                auVar66 = vpminsd_avx2(auVar69,auVar63);
                auVar63 = vpmaxsd_avx2(auVar69,auVar63);
                auVar69 = vpminsd_avx2(auVar62,auVar63);
                auVar62 = vpmaxsd_avx2(auVar62,auVar63);
                bVar36 = bVar36 - 1 & bVar36;
                if (bVar36 == 0) {
                  auVar63 = vpermi2q_avx512vl(auVar65,auVar61,auVar68);
                  uVar43 = auVar63._0_8_;
                  auVar63 = vpermt2q_avx512vl(auVar61,auVar62,auVar68);
                  *local_27d0 = auVar63._0_8_;
                  auVar62 = vpermd_avx2(auVar62,auVar60);
                  *(int *)(local_27d0 + 1) = auVar62._0_4_;
                  auVar62 = vpermt2q_avx512vl(auVar61,auVar69,auVar68);
                  local_27d0[2] = auVar62._0_8_;
                  auVar62 = vpermd_avx2(auVar69,auVar60);
                  *(int *)(local_27d0 + 3) = auVar62._0_4_;
                  auVar61 = vpermt2q_avx512vl(auVar61,auVar66,auVar68);
                  local_27d0[4] = auVar61._0_8_;
                  auVar60 = vpermd_avx2(auVar66,auVar60);
                  *(int *)(local_27d0 + 5) = auVar60._0_4_;
                  local_27d0 = local_27d0 + 6;
                }
                else {
                  auVar64 = valignd_avx512vl(auVar64,auVar64,3);
                  auVar63 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar65 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar63,auVar65);
                  auVar63 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar66 = vpermt2d_avx512vl(auVar65,auVar63,auVar66);
                  auVar66 = vpermt2d_avx512vl(auVar66,auVar63,auVar69);
                  auVar63 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar62 = vpermt2d_avx512vl(auVar66,auVar63,auVar62);
                  auVar114 = ZEXT3264(auVar62);
                  bVar39 = bVar36;
                  do {
                    auVar63 = auVar114._0_32_;
                    auVar70._8_4_ = 1;
                    auVar70._0_8_ = 0x100000001;
                    auVar70._12_4_ = 1;
                    auVar70._16_4_ = 1;
                    auVar70._20_4_ = 1;
                    auVar70._24_4_ = 1;
                    auVar70._28_4_ = 1;
                    auVar62 = vpermd_avx2(auVar70,auVar64);
                    auVar64 = valignd_avx512vl(auVar64,auVar64,1);
                    vpermt2q_avx512vl(auVar61,auVar64,auVar68);
                    bVar39 = bVar39 - 1 & bVar39;
                    uVar112 = vpcmpd_avx512vl(auVar62,auVar63,5);
                    auVar62 = vpmaxsd_avx2(auVar62,auVar63);
                    bVar37 = (byte)uVar112 << 1;
                    auVar63 = valignd_avx512vl(auVar63,auVar63,7);
                    bVar15 = (bool)((byte)uVar112 & 1);
                    auVar67._4_4_ = (uint)bVar15 * auVar63._4_4_ | (uint)!bVar15 * auVar62._4_4_;
                    auVar67._0_4_ = auVar62._0_4_;
                    bVar15 = (bool)(bVar37 >> 2 & 1);
                    auVar67._8_4_ = (uint)bVar15 * auVar63._8_4_ | (uint)!bVar15 * auVar62._8_4_;
                    bVar15 = (bool)(bVar37 >> 3 & 1);
                    auVar67._12_4_ = (uint)bVar15 * auVar63._12_4_ | (uint)!bVar15 * auVar62._12_4_;
                    bVar15 = (bool)(bVar37 >> 4 & 1);
                    auVar67._16_4_ = (uint)bVar15 * auVar63._16_4_ | (uint)!bVar15 * auVar62._16_4_;
                    bVar15 = (bool)(bVar37 >> 5 & 1);
                    auVar67._20_4_ = (uint)bVar15 * auVar63._20_4_ | (uint)!bVar15 * auVar62._20_4_;
                    bVar15 = (bool)(bVar37 >> 6 & 1);
                    auVar67._24_4_ = (uint)bVar15 * auVar63._24_4_ | (uint)!bVar15 * auVar62._24_4_;
                    auVar67._28_4_ =
                         (uint)(bVar37 >> 7) * auVar63._28_4_ |
                         (uint)!(bool)(bVar37 >> 7) * auVar62._28_4_;
                    auVar114 = ZEXT3264(auVar67);
                  } while (bVar39 != 0);
                  lVar38 = (ulong)(uint)POPCOUNT((uint)bVar36) + 3;
                  do {
                    auVar62 = vpermi2q_avx512vl(auVar67,auVar61,auVar68);
                    *local_27d0 = auVar62._0_8_;
                    auVar63 = auVar114._0_32_;
                    auVar62 = vpermd_avx2(auVar63,auVar60);
                    *(int *)(local_27d0 + 1) = auVar62._0_4_;
                    auVar67 = valignd_avx512vl(auVar63,auVar63,1);
                    local_27d0 = local_27d0 + 2;
                    auVar114 = ZEXT3264(auVar67);
                    lVar38 = lVar38 + -1;
                  } while (lVar38 != 0);
                  auVar60 = vpermt2q_avx512vl(auVar61,auVar67,auVar68);
                  uVar43 = auVar60._0_8_;
                }
                auVar117 = ZEXT3264(local_2680);
                auVar115 = ZEXT3264(auVar115._0_32_);
                auVar114 = ZEXT3264(_local_26e0);
                auVar125 = ZEXT3264(auVar125._0_32_);
                auVar137 = ZEXT3264(local_23e0);
                auVar60 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar138 = ZEXT3264(auVar60);
                auVar60 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar139 = ZEXT3264(auVar60);
                uVar42 = local_2780;
                ray = local_27c0;
                uVar45 = local_2788;
                uVar47 = local_2790;
                uVar48 = local_2798;
                uVar49 = local_27a0;
                uVar50 = local_27a8;
                context = local_27b8;
              }
            }
          }
        }
        local_2730 = (ulong)((uint)uVar43 & 0xf) - 8;
        if (local_2730 != 0) {
          uVar43 = uVar43 & 0xfffffffffffffff0;
          local_2728 = 0;
          do {
            lVar38 = local_2728 * 0x90;
            local_2720 = uVar43 + lVar38;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = *(ulong *)(uVar43 + 0x40 + lVar38);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = *(ulong *)(uVar43 + 0x48 + lVar38);
            uVar20 = vpcmpub_avx512vl(auVar94,auVar98,2);
            uVar101 = *(undefined4 *)(uVar43 + 0x70 + lVar38);
            auVar77._4_4_ = uVar101;
            auVar77._0_4_ = uVar101;
            auVar77._8_4_ = uVar101;
            auVar77._12_4_ = uVar101;
            auVar77._16_4_ = uVar101;
            auVar77._20_4_ = uVar101;
            auVar77._24_4_ = uVar101;
            auVar77._28_4_ = uVar101;
            uVar101 = *(undefined4 *)(uVar43 + 0x7c + lVar38);
            auVar80._4_4_ = uVar101;
            auVar80._0_4_ = uVar101;
            auVar80._8_4_ = uVar101;
            auVar80._12_4_ = uVar101;
            auVar80._16_4_ = uVar101;
            auVar80._20_4_ = uVar101;
            auVar80._24_4_ = uVar101;
            auVar80._28_4_ = uVar101;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(local_2738 + 0x40 + local_2720);
            auVar60 = vpmovzxbd_avx2(auVar59);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar54 = vfmadd213ps_fma(auVar60,auVar80,auVar77);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)(local_2740 + 0x40 + local_2720);
            auVar60 = vpmovzxbd_avx2(auVar16);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar59 = vfmadd213ps_fma(auVar60,auVar80,auVar77);
            uVar101 = *(undefined4 *)(uVar43 + 0x74 + lVar38);
            auVar78._4_4_ = uVar101;
            auVar78._0_4_ = uVar101;
            auVar78._8_4_ = uVar101;
            auVar78._12_4_ = uVar101;
            auVar78._16_4_ = uVar101;
            auVar78._20_4_ = uVar101;
            auVar78._24_4_ = uVar101;
            auVar78._28_4_ = uVar101;
            uVar101 = *(undefined4 *)(uVar43 + 0x80 + lVar38);
            auVar81._4_4_ = uVar101;
            auVar81._0_4_ = uVar101;
            auVar81._8_4_ = uVar101;
            auVar81._12_4_ = uVar101;
            auVar81._16_4_ = uVar101;
            auVar81._20_4_ = uVar101;
            auVar81._24_4_ = uVar101;
            auVar81._28_4_ = uVar101;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_2748 + 0x40 + local_2720);
            auVar60 = vpmovzxbd_avx2(auVar4);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar16 = vfmadd213ps_fma(auVar60,auVar81,auVar78);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_2750 + 0x40 + local_2720);
            auVar60 = vpmovzxbd_avx2(auVar5);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar55 = vfmadd213ps_fma(auVar60,auVar81,auVar78);
            uVar101 = *(undefined4 *)(uVar43 + 0x78 + lVar38);
            auVar79._4_4_ = uVar101;
            auVar79._0_4_ = uVar101;
            auVar79._8_4_ = uVar101;
            auVar79._12_4_ = uVar101;
            auVar79._16_4_ = uVar101;
            auVar79._20_4_ = uVar101;
            auVar79._24_4_ = uVar101;
            auVar79._28_4_ = uVar101;
            uVar101 = *(undefined4 *)(uVar43 + 0x84 + lVar38);
            auVar82._4_4_ = uVar101;
            auVar82._0_4_ = uVar101;
            auVar82._8_4_ = uVar101;
            auVar82._12_4_ = uVar101;
            auVar82._16_4_ = uVar101;
            auVar82._20_4_ = uVar101;
            auVar82._24_4_ = uVar101;
            auVar82._28_4_ = uVar101;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_2758 + 0x40 + local_2720);
            auVar60 = vpmovzxbd_avx2(auVar6);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar57 = vfmadd213ps_fma(auVar60,auVar82,auVar79);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(local_2760 + 0x40 + local_2720);
            auVar60 = vpmovzxbd_avx2(auVar7);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar58 = vfmadd213ps_fma(auVar60,auVar82,auVar79);
            auVar60 = vsubps_avx(ZEXT1632(auVar54),local_2680);
            auVar71._4_4_ = auVar60._4_4_ * fStack_261c;
            auVar71._0_4_ = auVar60._0_4_ * local_2620;
            auVar71._8_4_ = auVar60._8_4_ * fStack_2618;
            auVar71._12_4_ = auVar60._12_4_ * fStack_2614;
            auVar71._16_4_ = auVar60._16_4_ * fStack_2610;
            auVar71._20_4_ = auVar60._20_4_ * fStack_260c;
            auVar71._24_4_ = auVar60._24_4_ * fStack_2608;
            auVar71._28_4_ = auVar60._28_4_;
            auVar60 = vsubps_avx(ZEXT1632(auVar16),auVar121._0_32_);
            auVar72._4_4_ = auVar60._4_4_ * (float)local_2640._4_4_;
            auVar72._0_4_ = auVar60._0_4_ * (float)local_2640._0_4_;
            auVar72._8_4_ = auVar60._8_4_ * fStack_2638;
            auVar72._12_4_ = auVar60._12_4_ * fStack_2634;
            auVar72._16_4_ = auVar60._16_4_ * fStack_2630;
            auVar72._20_4_ = auVar60._20_4_ * fStack_262c;
            auVar72._24_4_ = auVar60._24_4_ * fStack_2628;
            auVar72._28_4_ = auVar60._28_4_;
            auVar60 = vmaxps_avx(auVar71,auVar72);
            auVar61 = vsubps_avx(ZEXT1632(auVar57),auVar124._0_32_);
            auVar73._4_4_ = auVar61._4_4_ * (float)local_26e0._4_4_;
            auVar73._0_4_ = auVar61._0_4_ * (float)local_26e0._0_4_;
            auVar73._8_4_ = auVar61._8_4_ * fStack_26d8;
            auVar73._12_4_ = auVar61._12_4_ * fStack_26d4;
            auVar73._16_4_ = auVar61._16_4_ * fStack_26d0;
            auVar73._20_4_ = auVar61._20_4_ * fStack_26cc;
            auVar73._24_4_ = auVar61._24_4_ * fStack_26c8;
            auVar73._28_4_ = auVar61._28_4_;
            auVar61 = vsubps_avx(ZEXT1632(auVar59),local_2680);
            auVar74._4_4_ = fVar91 * auVar61._4_4_;
            auVar74._0_4_ = fVar93 * auVar61._0_4_;
            auVar74._8_4_ = fVar92 * auVar61._8_4_;
            auVar74._12_4_ = fVar129 * auVar61._12_4_;
            auVar74._16_4_ = fVar130 * auVar61._16_4_;
            auVar74._20_4_ = fVar131 * auVar61._20_4_;
            auVar74._24_4_ = fVar132 * auVar61._24_4_;
            auVar74._28_4_ = auVar61._28_4_;
            auVar61 = vsubps_avx(ZEXT1632(auVar55),auVar121._0_32_);
            auVar75._4_4_ = auVar134._4_4_ * auVar61._4_4_;
            auVar75._0_4_ = auVar134._0_4_ * auVar61._0_4_;
            auVar75._8_4_ = auVar134._8_4_ * auVar61._8_4_;
            auVar75._12_4_ = auVar134._12_4_ * auVar61._12_4_;
            auVar75._16_4_ = auVar134._16_4_ * auVar61._16_4_;
            auVar75._20_4_ = auVar134._20_4_ * auVar61._20_4_;
            auVar75._24_4_ = auVar134._24_4_ * auVar61._24_4_;
            auVar75._28_4_ = auVar61._28_4_;
            auVar68 = vminps_avx(auVar74,auVar75);
            auVar61 = vsubps_avx(ZEXT1632(auVar58),auVar124._0_32_);
            auVar76._4_4_ = auVar136._4_4_ * auVar61._4_4_;
            auVar76._0_4_ = auVar136._0_4_ * auVar61._0_4_;
            auVar76._8_4_ = auVar136._8_4_ * auVar61._8_4_;
            auVar76._12_4_ = auVar136._12_4_ * auVar61._12_4_;
            auVar76._16_4_ = auVar136._16_4_ * auVar61._16_4_;
            auVar76._20_4_ = auVar136._20_4_ * auVar61._20_4_;
            auVar76._24_4_ = auVar136._24_4_ * auVar61._24_4_;
            auVar76._28_4_ = auVar61._28_4_;
            auVar61 = vmaxps_avx(auVar73,auVar125._0_32_);
            local_23c0 = vmaxps_avx(auVar60,auVar61);
            auVar60 = vminps_avx512vl(auVar76,auVar137._0_32_);
            auVar60 = vminps_avx(auVar68,auVar60);
            uVar112 = vcmpps_avx512vl(local_23c0,auVar60,2);
            if ((byte)((byte)uVar112 & (byte)uVar20) != 0) {
              local_2718 = (ulong)(byte)((byte)uVar112 & (byte)uVar20);
              do {
                lVar38 = 0;
                for (uVar18 = local_2718; (uVar18 & 1) == 0;
                    uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar38 = lVar38 + 1;
                }
                fVar105 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_23c0 + lVar38 * 4) <= fVar105) {
                  uVar8 = *(ushort *)(local_2720 + lVar38 * 8);
                  uVar9 = *(ushort *)(local_2720 + 2 + lVar38 * 8);
                  uVar10 = *(uint *)(local_2720 + 0x88);
                  local_2778 = (ulong)uVar10;
                  uVar40 = *(uint *)(local_2720 + 4 + lVar38 * 8);
                  pGVar11 = (context->scene->geometries).items[local_2778].ptr;
                  lVar38 = *(long *)&pGVar11->field_0x58;
                  local_2768 = (ulong)uVar40;
                  lVar41 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar40;
                  uVar44 = uVar9 & 0x7fff;
                  uVar46 = *(uint *)(lVar38 + 4 + lVar41);
                  uVar45 = (ulong)uVar46;
                  local_2660._0_4_ = uVar44;
                  uVar47 = (ulong)(uVar46 * uVar44 + *(int *)(lVar38 + lVar41) + (uVar8 & 0x7fff));
                  lVar12 = *(long *)&pGVar11[1].time_range.upper;
                  p_Var13 = pGVar11[1].intersectionFilterN;
                  auVar54 = *(undefined1 (*) [16])(lVar12 + (uVar47 + 1) * (long)p_Var13);
                  auVar59 = *(undefined1 (*) [16])(lVar12 + (uVar47 + uVar45) * (long)p_Var13);
                  lVar51 = uVar47 + uVar45 + 1;
                  auVar16 = *(undefined1 (*) [16])(lVar12 + lVar51 * (long)p_Var13);
                  uVar42 = (ulong)(-1 < (short)uVar8);
                  auVar55 = *(undefined1 (*) [16])(lVar12 + (uVar47 + uVar42 + 1) * (long)p_Var13);
                  lVar52 = uVar42 + lVar51;
                  auVar57 = *(undefined1 (*) [16])(lVar12 + lVar52 * (long)p_Var13);
                  uVar42 = 0;
                  if (-1 < (short)uVar9) {
                    uVar42 = uVar45;
                  }
                  auVar58 = *(undefined1 (*) [16])
                             (lVar12 + (uVar47 + uVar45 + uVar42) * (long)p_Var13);
                  auVar56 = *(undefined1 (*) [16])(lVar12 + (lVar51 + uVar42) * (long)p_Var13);
                  auVar118._16_16_ =
                       *(undefined1 (*) [16])(lVar12 + (uVar42 + lVar52) * (long)p_Var13);
                  auVar118._0_16_ = auVar16;
                  auVar4 = vunpcklps_avx(auVar54,auVar57);
                  auVar109 = vunpckhps_avx(auVar54,auVar57);
                  auVar5 = vunpcklps_avx(auVar55,auVar16);
                  auVar55 = vunpckhps_avx(auVar55,auVar16);
                  auVar6 = vunpcklps_avx(auVar109,auVar55);
                  auVar7 = vunpcklps_avx(auVar4,auVar5);
                  auVar55 = vunpckhps_avx(auVar4,auVar5);
                  auVar4 = vunpcklps_avx(auVar59,auVar56);
                  auVar109 = vunpckhps_avx(auVar59,auVar56);
                  auVar5 = vunpcklps_avx(auVar16,auVar58);
                  auVar58 = vunpckhps_avx(auVar16,auVar58);
                  auVar109 = vunpcklps_avx(auVar109,auVar58);
                  auVar94 = vunpcklps_avx(auVar4,auVar5);
                  auVar58 = vunpckhps_avx(auVar4,auVar5);
                  auVar107._16_16_ = auVar56;
                  auVar107._0_16_ = auVar59;
                  auVar103._16_16_ = auVar57;
                  auVar103._0_16_ = auVar54;
                  auVar60 = vunpcklps_avx(auVar103,auVar107);
                  auVar99._16_16_ = auVar16;
                  auVar99._0_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var13 * uVar47);
                  auVar61 = vunpcklps_avx(auVar99,auVar118);
                  auVar62 = vunpcklps_avx(auVar61,auVar60);
                  auVar61 = vunpckhps_avx(auVar61,auVar60);
                  auVar60 = vunpckhps_avx(auVar103,auVar107);
                  auVar68 = vunpckhps_avx(auVar99,auVar118);
                  auVar68 = vunpcklps_avx(auVar68,auVar60);
                  auVar104._16_16_ = auVar7;
                  auVar104._0_16_ = auVar7;
                  auVar108._16_16_ = auVar55;
                  auVar108._0_16_ = auVar55;
                  auVar113._16_16_ = auVar6;
                  auVar113._0_16_ = auVar6;
                  auVar119._16_16_ = auVar94;
                  auVar119._0_16_ = auVar94;
                  auVar133._16_16_ = auVar58;
                  auVar133._0_16_ = auVar58;
                  uVar101 = *(undefined4 *)&(local_27c0->super_RayK<1>).org.field_0;
                  auVar135._4_4_ = uVar101;
                  auVar135._0_4_ = uVar101;
                  auVar135._8_4_ = uVar101;
                  auVar135._12_4_ = uVar101;
                  auVar135._16_4_ = uVar101;
                  auVar135._20_4_ = uVar101;
                  auVar135._24_4_ = uVar101;
                  auVar135._28_4_ = uVar101;
                  auVar63 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(local_27c0->super_RayK<1>).org.field_0.m128[1]
                                              ));
                  auVar66 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(local_27c0->super_RayK<1>).org.field_0.m128[2]
                                              ));
                  uVar101 = *(undefined4 *)&(local_27c0->super_RayK<1>).dir.field_0;
                  auVar116._4_4_ = uVar101;
                  auVar116._0_4_ = uVar101;
                  auVar116._8_4_ = uVar101;
                  auVar116._12_4_ = uVar101;
                  auVar116._16_4_ = uVar101;
                  auVar116._20_4_ = uVar101;
                  auVar116._24_4_ = uVar101;
                  auVar116._28_4_ = uVar101;
                  auVar127._16_16_ = auVar109;
                  auVar127._0_16_ = auVar109;
                  uVar101 = *(undefined4 *)((long)&(local_27c0->super_RayK<1>).dir.field_0 + 4);
                  auVar122._4_4_ = uVar101;
                  auVar122._0_4_ = uVar101;
                  auVar122._8_4_ = uVar101;
                  auVar122._12_4_ = uVar101;
                  auVar122._16_4_ = uVar101;
                  auVar122._20_4_ = uVar101;
                  auVar122._24_4_ = uVar101;
                  auVar122._28_4_ = uVar101;
                  fVar102 = (local_27c0->super_RayK<1>).dir.field_0.m128[2];
                  auVar126._4_4_ = fVar102;
                  auVar126._0_4_ = fVar102;
                  auVar126._8_4_ = fVar102;
                  auVar126._12_4_ = fVar102;
                  auVar126._16_4_ = fVar102;
                  auVar126._20_4_ = fVar102;
                  auVar126._24_4_ = fVar102;
                  auVar126._28_4_ = fVar102;
                  auVar60 = vsubps_avx(auVar62,auVar135);
                  auVar62 = vsubps_avx512vl(auVar61,auVar63);
                  auVar68 = vsubps_avx512vl(auVar68,auVar66);
                  auVar61 = vsubps_avx(auVar104,auVar135);
                  auVar69 = vsubps_avx512vl(auVar108,auVar63);
                  auVar65 = vsubps_avx512vl(auVar113,auVar66);
                  auVar64 = vsubps_avx512vl(auVar119,auVar135);
                  auVar63 = vsubps_avx512vl(auVar133,auVar63);
                  auVar66 = vsubps_avx512vl(auVar127,auVar66);
                  auVar67 = vsubps_avx512vl(auVar64,auVar60);
                  auVar70 = vsubps_avx512vl(auVar63,auVar62);
                  auVar71 = vsubps_avx512vl(auVar66,auVar68);
                  auVar72 = vsubps_avx512vl(auVar60,auVar61);
                  auVar73 = vsubps_avx512vl(auVar62,auVar69);
                  auVar74 = vsubps_avx512vl(auVar68,auVar65);
                  auVar75 = vsubps_avx512vl(auVar61,auVar64);
                  auVar76 = vsubps_avx512vl(auVar69,auVar63);
                  auVar77 = vsubps_avx512vl(auVar65,auVar66);
                  auVar78 = vaddps_avx512vl(auVar64,auVar60);
                  auVar79 = vaddps_avx512vl(auVar63,auVar62);
                  auVar80 = vaddps_avx512vl(auVar66,auVar68);
                  auVar81 = vmulps_avx512vl(auVar79,auVar71);
                  auVar81 = vfmsub231ps_avx512vl(auVar81,auVar70,auVar80);
                  auVar80 = vmulps_avx512vl(auVar80,auVar67);
                  auVar80 = vfmsub231ps_avx512vl(auVar80,auVar71,auVar78);
                  auVar78 = vmulps_avx512vl(auVar78,auVar70);
                  auVar54 = vfmsub231ps_fma(auVar78,auVar67,auVar79);
                  auVar120._0_4_ = fVar102 * auVar54._0_4_;
                  auVar120._4_4_ = fVar102 * auVar54._4_4_;
                  auVar120._8_4_ = fVar102 * auVar54._8_4_;
                  auVar120._12_4_ = fVar102 * auVar54._12_4_;
                  auVar120._16_4_ = fVar102 * 0.0;
                  auVar120._20_4_ = fVar102 * 0.0;
                  auVar120._24_4_ = fVar102 * 0.0;
                  auVar120._28_4_ = 0;
                  auVar78 = vfmadd231ps_avx512vl(auVar120,auVar122,auVar80);
                  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar116,auVar81);
                  auVar128._0_4_ = auVar60._0_4_ + auVar61._0_4_;
                  auVar128._4_4_ = auVar60._4_4_ + auVar61._4_4_;
                  auVar128._8_4_ = auVar60._8_4_ + auVar61._8_4_;
                  auVar128._12_4_ = auVar60._12_4_ + auVar61._12_4_;
                  auVar128._16_4_ = auVar60._16_4_ + auVar61._16_4_;
                  auVar128._20_4_ = auVar60._20_4_ + auVar61._20_4_;
                  auVar128._24_4_ = auVar60._24_4_ + auVar61._24_4_;
                  auVar128._28_4_ = auVar60._28_4_ + auVar61._28_4_;
                  auVar79 = vaddps_avx512vl(auVar62,auVar69);
                  auVar80 = vaddps_avx512vl(auVar68,auVar65);
                  auVar81 = vmulps_avx512vl(auVar79,auVar74);
                  auVar81 = vfmsub231ps_avx512vl(auVar81,auVar73,auVar80);
                  auVar80 = vmulps_avx512vl(auVar80,auVar72);
                  auVar80 = vfmsub231ps_avx512vl(auVar80,auVar74,auVar128);
                  auVar82 = vmulps_avx512vl(auVar128,auVar73);
                  auVar79 = vfmsub231ps_avx512vl(auVar82,auVar72,auVar79);
                  auVar29._4_4_ = fVar102 * auVar79._4_4_;
                  auVar29._0_4_ = fVar102 * auVar79._0_4_;
                  auVar29._8_4_ = fVar102 * auVar79._8_4_;
                  auVar29._12_4_ = fVar102 * auVar79._12_4_;
                  auVar29._16_4_ = fVar102 * auVar79._16_4_;
                  auVar29._20_4_ = fVar102 * auVar79._20_4_;
                  auVar29._24_4_ = fVar102 * auVar79._24_4_;
                  auVar29._28_4_ = auVar79._28_4_;
                  auVar79 = vfmadd231ps_avx512vl(auVar29,auVar122,auVar80);
                  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar116,auVar81);
                  auVar61 = vaddps_avx512vl(auVar61,auVar64);
                  auVar63 = vaddps_avx512vl(auVar69,auVar63);
                  auVar66 = vaddps_avx512vl(auVar65,auVar66);
                  auVar69 = vmulps_avx512vl(auVar63,auVar77);
                  auVar69 = vfmsub231ps_avx512vl(auVar69,auVar76,auVar66);
                  auVar30._4_4_ = auVar66._4_4_ * auVar75._4_4_;
                  auVar30._0_4_ = auVar66._0_4_ * auVar75._0_4_;
                  auVar30._8_4_ = auVar66._8_4_ * auVar75._8_4_;
                  auVar30._12_4_ = auVar66._12_4_ * auVar75._12_4_;
                  auVar30._16_4_ = auVar66._16_4_ * auVar75._16_4_;
                  auVar30._20_4_ = auVar66._20_4_ * auVar75._20_4_;
                  auVar30._24_4_ = auVar66._24_4_ * auVar75._24_4_;
                  auVar30._28_4_ = auVar66._28_4_;
                  auVar54 = vfmsub231ps_fma(auVar30,auVar77,auVar61);
                  auVar31._4_4_ = auVar61._4_4_ * auVar76._4_4_;
                  auVar31._0_4_ = auVar61._0_4_ * auVar76._0_4_;
                  auVar31._8_4_ = auVar61._8_4_ * auVar76._8_4_;
                  auVar31._12_4_ = auVar61._12_4_ * auVar76._12_4_;
                  auVar31._16_4_ = auVar61._16_4_ * auVar76._16_4_;
                  auVar31._20_4_ = auVar61._20_4_ * auVar76._20_4_;
                  auVar31._24_4_ = auVar61._24_4_ * auVar76._24_4_;
                  auVar31._28_4_ = auVar61._28_4_;
                  auVar61 = vfmsub231ps_avx512vl(auVar31,auVar75,auVar63);
                  auVar61 = vmulps_avx512vl(auVar126,auVar61);
                  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar122,ZEXT1632(auVar54));
                  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar116,auVar69);
                  auVar100._0_4_ = auVar78._0_4_ + auVar79._0_4_;
                  auVar100._4_4_ = auVar78._4_4_ + auVar79._4_4_;
                  auVar100._8_4_ = auVar78._8_4_ + auVar79._8_4_;
                  auVar100._12_4_ = auVar78._12_4_ + auVar79._12_4_;
                  auVar100._16_4_ = auVar78._16_4_ + auVar79._16_4_;
                  auVar100._20_4_ = auVar78._20_4_ + auVar79._20_4_;
                  auVar100._24_4_ = auVar78._24_4_ + auVar79._24_4_;
                  auVar100._28_4_ = auVar78._28_4_ + auVar79._28_4_;
                  local_25a0 = vaddps_avx512vl(auVar61,auVar100);
                  auVar21._8_4_ = 0x7fffffff;
                  auVar21._0_8_ = 0x7fffffff7fffffff;
                  auVar21._12_4_ = 0x7fffffff;
                  auVar21._16_4_ = 0x7fffffff;
                  auVar21._20_4_ = 0x7fffffff;
                  auVar21._24_4_ = 0x7fffffff;
                  auVar21._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_25a0,auVar21);
                  auVar22._8_4_ = 0x34000000;
                  auVar22._0_8_ = 0x3400000034000000;
                  auVar22._12_4_ = 0x34000000;
                  auVar22._16_4_ = 0x34000000;
                  auVar22._20_4_ = 0x34000000;
                  auVar22._24_4_ = 0x34000000;
                  auVar22._28_4_ = 0x34000000;
                  auVar63 = vmulps_avx512vl(local_25a0,auVar22);
                  auVar66 = vminps_avx512vl(auVar78,auVar79);
                  auVar66 = vminps_avx512vl(auVar66,auVar61);
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar23._16_4_ = 0x80000000;
                  auVar23._20_4_ = 0x80000000;
                  auVar23._24_4_ = 0x80000000;
                  auVar23._28_4_ = 0x80000000;
                  auVar69 = vxorps_avx512vl(auVar63,auVar23);
                  uVar112 = vcmpps_avx512vl(auVar66,auVar69,5);
                  auVar66 = vmaxps_avx512vl(auVar78,auVar79);
                  auVar61 = vmaxps_avx512vl(auVar66,auVar61);
                  uVar20 = vcmpps_avx512vl(auVar61,auVar63,2);
                  bVar36 = (byte)uVar112 | (byte)uVar20;
                  ray = local_27c0;
                  if (bVar36 != 0) {
                    auVar61 = vmulps_avx512vl(auVar71,auVar73);
                    auVar63 = vmulps_avx512vl(auVar67,auVar74);
                    auVar66 = vmulps_avx512vl(auVar70,auVar72);
                    auVar69 = vmulps_avx512vl(auVar74,auVar76);
                    auVar65 = vmulps_avx512vl(auVar72,auVar77);
                    auVar64 = vmulps_avx512vl(auVar73,auVar75);
                    auVar70 = vfmsub213ps_avx512vl(auVar70,auVar74,auVar61);
                    auVar71 = vfmsub213ps_avx512vl(auVar71,auVar72,auVar63);
                    auVar67 = vfmsub213ps_avx512vl(auVar67,auVar73,auVar66);
                    auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar69);
                    auVar74 = vfmsub213ps_avx512vl(auVar75,auVar74,auVar65);
                    auVar72 = vfmsub213ps_avx512vl(auVar76,auVar72,auVar64);
                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    vandps_avx512vl(auVar61,auVar75);
                    vandps_avx512vl(auVar69,auVar75);
                    uVar42 = vcmpps_avx512vl(auVar75,auVar75,1);
                    vandps_avx512vl(auVar63,auVar75);
                    vandps_avx512vl(auVar65,auVar75);
                    uVar45 = vcmpps_avx512vl(auVar75,auVar75,1);
                    vandps_avx512vl(auVar66,auVar75);
                    vandps_avx512vl(auVar64,auVar75);
                    uVar47 = vcmpps_avx512vl(auVar75,auVar75,1);
                    bVar15 = (bool)((byte)uVar42 & 1);
                    auVar83._0_4_ =
                         (float)((uint)bVar15 * auVar70._0_4_ | (uint)!bVar15 * auVar73._0_4_);
                    bVar15 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar83._4_4_ =
                         (float)((uint)bVar15 * auVar70._4_4_ | (uint)!bVar15 * auVar73._4_4_);
                    bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar83._8_4_ =
                         (float)((uint)bVar15 * auVar70._8_4_ | (uint)!bVar15 * auVar73._8_4_);
                    bVar15 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar83._12_4_ =
                         (float)((uint)bVar15 * auVar70._12_4_ | (uint)!bVar15 * auVar73._12_4_);
                    bVar15 = (bool)((byte)(uVar42 >> 4) & 1);
                    auVar83._16_4_ =
                         (float)((uint)bVar15 * auVar70._16_4_ | (uint)!bVar15 * auVar73._16_4_);
                    bVar15 = (bool)((byte)(uVar42 >> 5) & 1);
                    auVar83._20_4_ =
                         (float)((uint)bVar15 * auVar70._20_4_ | (uint)!bVar15 * auVar73._20_4_);
                    bVar15 = (bool)((byte)(uVar42 >> 6) & 1);
                    auVar83._24_4_ =
                         (float)((uint)bVar15 * auVar70._24_4_ | (uint)!bVar15 * auVar73._24_4_);
                    bVar15 = SUB81(uVar42 >> 7,0);
                    auVar83._28_4_ = (uint)bVar15 * auVar70._28_4_ | (uint)!bVar15 * auVar73._28_4_;
                    bVar15 = (bool)((byte)uVar45 & 1);
                    auVar84._0_4_ =
                         (float)((uint)bVar15 * auVar71._0_4_ | (uint)!bVar15 * auVar74._0_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 1) & 1);
                    auVar84._4_4_ =
                         (float)((uint)bVar15 * auVar71._4_4_ | (uint)!bVar15 * auVar74._4_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 2) & 1);
                    auVar84._8_4_ =
                         (float)((uint)bVar15 * auVar71._8_4_ | (uint)!bVar15 * auVar74._8_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 3) & 1);
                    auVar84._12_4_ =
                         (float)((uint)bVar15 * auVar71._12_4_ | (uint)!bVar15 * auVar74._12_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 4) & 1);
                    auVar84._16_4_ =
                         (float)((uint)bVar15 * auVar71._16_4_ | (uint)!bVar15 * auVar74._16_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 5) & 1);
                    auVar84._20_4_ =
                         (float)((uint)bVar15 * auVar71._20_4_ | (uint)!bVar15 * auVar74._20_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 6) & 1);
                    auVar84._24_4_ =
                         (float)((uint)bVar15 * auVar71._24_4_ | (uint)!bVar15 * auVar74._24_4_);
                    bVar15 = SUB81(uVar45 >> 7,0);
                    auVar84._28_4_ = (uint)bVar15 * auVar71._28_4_ | (uint)!bVar15 * auVar74._28_4_;
                    bVar15 = (bool)((byte)uVar47 & 1);
                    fVar53 = (float)((uint)bVar15 * auVar67._0_4_ | (uint)!bVar15 * auVar72._0_4_);
                    bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
                    fVar87 = (float)((uint)bVar15 * auVar67._4_4_ | (uint)!bVar15 * auVar72._4_4_);
                    bVar15 = (bool)((byte)(uVar47 >> 2) & 1);
                    fVar88 = (float)((uint)bVar15 * auVar67._8_4_ | (uint)!bVar15 * auVar72._8_4_);
                    bVar15 = (bool)((byte)(uVar47 >> 3) & 1);
                    fVar89 = (float)((uint)bVar15 * auVar67._12_4_ | (uint)!bVar15 * auVar72._12_4_)
                    ;
                    bVar15 = (bool)((byte)(uVar47 >> 4) & 1);
                    fVar90 = (float)((uint)bVar15 * auVar67._16_4_ | (uint)!bVar15 * auVar72._16_4_)
                    ;
                    bVar15 = (bool)((byte)(uVar47 >> 5) & 1);
                    fVar91 = (float)((uint)bVar15 * auVar67._20_4_ | (uint)!bVar15 * auVar72._20_4_)
                    ;
                    bVar15 = (bool)((byte)(uVar47 >> 6) & 1);
                    fVar92 = (float)((uint)bVar15 * auVar67._24_4_ | (uint)!bVar15 * auVar72._24_4_)
                    ;
                    bVar15 = SUB81(uVar47 >> 7,0);
                    auVar32._4_4_ = fVar102 * fVar87;
                    auVar32._0_4_ = fVar102 * fVar53;
                    auVar32._8_4_ = fVar102 * fVar88;
                    auVar32._12_4_ = fVar102 * fVar89;
                    auVar32._16_4_ = fVar102 * fVar90;
                    auVar32._20_4_ = fVar102 * fVar91;
                    auVar32._24_4_ = fVar102 * fVar92;
                    auVar32._28_4_ = fVar102;
                    auVar54 = vfmadd213ps_fma(auVar122,auVar84,auVar32);
                    auVar54 = vfmadd213ps_fma(auVar116,auVar83,ZEXT1632(auVar54));
                    auVar63 = ZEXT1632(CONCAT412(auVar54._12_4_ + auVar54._12_4_,
                                                 CONCAT48(auVar54._8_4_ + auVar54._8_4_,
                                                          CONCAT44(auVar54._4_4_ + auVar54._4_4_,
                                                                   auVar54._0_4_ + auVar54._0_4_))))
                    ;
                    auVar123._0_4_ = auVar68._0_4_ * fVar53;
                    auVar123._4_4_ = auVar68._4_4_ * fVar87;
                    auVar123._8_4_ = auVar68._8_4_ * fVar88;
                    auVar123._12_4_ = auVar68._12_4_ * fVar89;
                    auVar123._16_4_ = auVar68._16_4_ * fVar90;
                    auVar123._20_4_ = auVar68._20_4_ * fVar91;
                    auVar123._24_4_ = auVar68._24_4_ * fVar92;
                    auVar123._28_4_ = 0;
                    auVar54 = vfmadd213ps_fma(auVar62,auVar84,auVar123);
                    auVar59 = vfmadd213ps_fma(auVar60,auVar83,ZEXT1632(auVar54));
                    auVar60 = vrcp14ps_avx512vl(auVar63);
                    auVar24._8_4_ = 0x80000000;
                    auVar24._0_8_ = 0x8000000080000000;
                    auVar24._12_4_ = 0x80000000;
                    auVar24._16_4_ = 0x80000000;
                    auVar24._20_4_ = 0x80000000;
                    auVar24._24_4_ = 0x80000000;
                    auVar24._28_4_ = 0x80000000;
                    auVar61 = vxorps_avx512vl(auVar63,auVar24);
                    auVar25._8_4_ = 0x3f800000;
                    auVar25._0_8_ = 0x3f8000003f800000;
                    auVar25._12_4_ = 0x3f800000;
                    auVar25._16_4_ = 0x3f800000;
                    auVar25._20_4_ = 0x3f800000;
                    auVar25._24_4_ = 0x3f800000;
                    auVar25._28_4_ = 0x3f800000;
                    auVar68 = vfnmadd213ps_avx512vl(auVar60,auVar63,auVar25);
                    auVar54 = vfmadd132ps_fma(auVar68,auVar60,auVar60);
                    local_2520._28_4_ = auVar60._28_4_;
                    local_2520._0_28_ =
                         ZEXT1628(CONCAT412(auVar54._12_4_ * (auVar59._12_4_ + auVar59._12_4_),
                                            CONCAT48(auVar54._8_4_ * (auVar59._8_4_ + auVar59._8_4_)
                                                     ,CONCAT44(auVar54._4_4_ *
                                                               (auVar59._4_4_ + auVar59._4_4_),
                                                               auVar54._0_4_ *
                                                               (auVar59._0_4_ + auVar59._0_4_)))));
                    auVar114 = ZEXT3264(local_2520);
                    auVar95._4_4_ = fVar105;
                    auVar95._0_4_ = fVar105;
                    auVar95._8_4_ = fVar105;
                    auVar95._12_4_ = fVar105;
                    auVar95._16_4_ = fVar105;
                    auVar95._20_4_ = fVar105;
                    auVar95._24_4_ = fVar105;
                    auVar95._28_4_ = fVar105;
                    uVar112 = vcmpps_avx512vl(local_2520,auVar95,2);
                    uVar101 = *(undefined4 *)((long)&(local_27c0->super_RayK<1>).org.field_0 + 0xc);
                    auVar26._4_4_ = uVar101;
                    auVar26._0_4_ = uVar101;
                    auVar26._8_4_ = uVar101;
                    auVar26._12_4_ = uVar101;
                    auVar26._16_4_ = uVar101;
                    auVar26._20_4_ = uVar101;
                    auVar26._24_4_ = uVar101;
                    auVar26._28_4_ = uVar101;
                    uVar20 = vcmpps_avx512vl(local_2520,auVar26,0xd);
                    uVar19 = vcmpps_avx512vl(auVar63,auVar61,4);
                    bVar36 = (byte)uVar112 & (byte)uVar20 & (byte)uVar19 & bVar36;
                    if (bVar36 != 0) {
                      uVar46 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                                       ((long)&(local_27c0->super_RayK<1>).org.
                                                               field_0 + 0xc),0x10),2);
                      local_2580 = &local_27c1;
                      local_2578 = bVar36;
                      auVar60 = vsubps_avx(local_25a0,auVar79);
                      auVar60 = vblendps_avx(auVar78,auVar60,0xf0);
                      auVar61 = vsubps_avx(local_25a0,auVar78);
                      local_25c0 = vblendps_avx(auVar79,auVar61,0xf0);
                      local_2500[0] = auVar83._0_4_ * 1.0;
                      local_2500[1] = auVar83._4_4_ * 1.0;
                      local_2500[2] = auVar83._8_4_ * 1.0;
                      local_2500[3] = auVar83._12_4_ * 1.0;
                      fStack_24f0 = auVar83._16_4_ * -1.0;
                      fStack_24ec = auVar83._20_4_ * -1.0;
                      fStack_24e8 = auVar83._24_4_ * -1.0;
                      uStack_24e4 = auVar83._28_4_;
                      local_24e0[0] = auVar84._0_4_ * 1.0;
                      local_24e0[1] = auVar84._4_4_ * 1.0;
                      local_24e0[2] = auVar84._8_4_ * 1.0;
                      local_24e0[3] = auVar84._12_4_ * 1.0;
                      fStack_24d0 = auVar84._16_4_ * -1.0;
                      fStack_24cc = auVar84._20_4_ * -1.0;
                      fStack_24c8 = auVar84._24_4_ * -1.0;
                      uStack_24c4 = auVar84._28_4_;
                      local_24c0[0] = fVar53 * 1.0;
                      local_24c0[1] = fVar87 * 1.0;
                      local_24c0[2] = fVar88 * 1.0;
                      local_24c0[3] = fVar89 * 1.0;
                      fStack_24b0 = fVar90 * -1.0;
                      fStack_24ac = fVar91 * -1.0;
                      fStack_24a8 = fVar92 * -1.0;
                      uStack_24a4 = (uint)bVar15 * auVar67._28_4_ | (uint)!bVar15 * auVar72._28_4_;
                      auVar61 = vpbroadcastd_avx512vl();
                      auVar61 = vpaddd_avx2(auVar61,_DAT_01fec4a0);
                      auVar54 = vcvtsi2ss_avx512f(in_XMM27,*(ushort *)(lVar38 + 8 + lVar41) - 1);
                      auVar110._4_12_ = ZEXT812(0) << 0x20;
                      auVar110._0_4_ = auVar54._0_4_;
                      auVar59 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar110);
                      auVar54 = vfnmadd213ss_fma(auVar59,auVar54,ZEXT416(0x40000000));
                      fVar105 = auVar59._0_4_ * auVar54._0_4_;
                      auVar61 = vcvtdq2ps_avx(auVar61);
                      fVar91 = auVar61._28_4_ + auVar60._28_4_;
                      fVar102 = (local_25a0._0_4_ * auVar61._0_4_ + auVar60._0_4_) * fVar105;
                      fVar53 = (local_25a0._4_4_ * auVar61._4_4_ + auVar60._4_4_) * fVar105;
                      local_25e0._4_4_ = fVar53;
                      local_25e0._0_4_ = fVar102;
                      fVar87 = (local_25a0._8_4_ * auVar61._8_4_ + auVar60._8_4_) * fVar105;
                      local_25e0._8_4_ = fVar87;
                      fVar88 = (local_25a0._12_4_ * auVar61._12_4_ + auVar60._12_4_) * fVar105;
                      local_25e0._12_4_ = fVar88;
                      fVar89 = (local_25a0._16_4_ * auVar61._16_4_ + auVar60._16_4_) * fVar105;
                      local_25e0._16_4_ = fVar89;
                      fVar90 = (local_25a0._20_4_ * auVar61._20_4_ + auVar60._20_4_) * fVar105;
                      local_25e0._20_4_ = fVar90;
                      fVar105 = (local_25a0._24_4_ * auVar61._24_4_ + auVar60._24_4_) * fVar105;
                      local_25e0._24_4_ = fVar105;
                      local_25e0._28_4_ = fVar91;
                      pGVar11 = (context->scene->geometries).items[local_2778].ptr;
                      if ((pGVar11->mask & uVar46) != 0) {
                        auVar60 = vpbroadcastd_avx512vl();
                        auVar60 = vpaddd_avx2(auVar60,_DAT_01fec4c0);
                        auVar60 = vcvtdq2ps_avx(auVar60);
                        auVar106._0_4_ = (float)(int)(*(ushort *)(lVar38 + 10 + lVar41) - 1);
                        auVar106._4_12_ = auVar78._4_12_;
                        auVar35._12_4_ = 0;
                        auVar35._0_12_ = ZEXT812(0);
                        auVar59 = vrcp14ss_avx512f(auVar35 << 0x20,ZEXT416((uint)auVar106._0_4_));
                        auVar54 = vfnmadd213ss_fma(auVar59,auVar106,ZEXT416(0x40000000));
                        fVar17 = auVar59._0_4_ * auVar54._0_4_;
                        auVar27._8_4_ = 0x219392ef;
                        auVar27._0_8_ = 0x219392ef219392ef;
                        auVar27._12_4_ = 0x219392ef;
                        auVar27._16_4_ = 0x219392ef;
                        auVar27._20_4_ = 0x219392ef;
                        auVar27._24_4_ = 0x219392ef;
                        auVar27._28_4_ = 0x219392ef;
                        uVar42 = vcmpps_avx512vl(local_25a0,auVar27,5);
                        auVar61 = vrcp14ps_avx512vl(local_25a0);
                        auVar111._8_4_ = 0x3f800000;
                        auVar111._0_8_ = 0x3f8000003f800000;
                        auVar111._12_4_ = 0x3f800000;
                        auVar111._16_4_ = 0x3f800000;
                        auVar111._20_4_ = 0x3f800000;
                        auVar111._24_4_ = 0x3f800000;
                        auVar111._28_4_ = 0x3f800000;
                        auVar54 = vfnmadd213ps_fma(local_25a0,auVar61,auVar111);
                        auVar61 = vfmadd132ps_avx512vl(ZEXT1632(auVar54),auVar61,auVar61);
                        fVar1 = (float)((uint)((byte)uVar42 & 1) * auVar61._0_4_);
                        fVar93 = (float)((uint)((byte)(uVar42 >> 1) & 1) * auVar61._4_4_);
                        fVar132 = (float)((uint)((byte)(uVar42 >> 2) & 1) * auVar61._8_4_);
                        fVar131 = (float)((uint)((byte)(uVar42 >> 3) & 1) * auVar61._12_4_);
                        fVar130 = (float)((uint)((byte)(uVar42 >> 4) & 1) * auVar61._16_4_);
                        fVar129 = (float)((uint)((byte)(uVar42 >> 5) & 1) * auVar61._20_4_);
                        fVar92 = (float)((uint)((byte)(uVar42 >> 6) & 1) * auVar61._24_4_);
                        auVar33._4_4_ = fVar53 * fVar93;
                        auVar33._0_4_ = fVar102 * fVar1;
                        auVar33._8_4_ = fVar87 * fVar132;
                        auVar33._12_4_ = fVar88 * fVar131;
                        auVar33._16_4_ = fVar89 * fVar130;
                        auVar33._20_4_ = fVar90 * fVar129;
                        auVar33._24_4_ = fVar105 * fVar92;
                        auVar33._28_4_ = fVar91;
                        local_2560 = vminps_avx(auVar33,auVar111);
                        auVar34._4_4_ =
                             (local_25a0._4_4_ * auVar60._4_4_ + local_25c0._4_4_) * fVar17 * fVar93
                        ;
                        auVar34._0_4_ =
                             (local_25a0._0_4_ * auVar60._0_4_ + local_25c0._0_4_) * fVar17 * fVar1;
                        auVar34._8_4_ =
                             (local_25a0._8_4_ * auVar60._8_4_ + local_25c0._8_4_) * fVar17 *
                             fVar132;
                        auVar34._12_4_ =
                             (local_25a0._12_4_ * auVar60._12_4_ + local_25c0._12_4_) * fVar17 *
                             fVar131;
                        auVar34._16_4_ =
                             (local_25a0._16_4_ * auVar60._16_4_ + local_25c0._16_4_) * fVar17 *
                             fVar130;
                        auVar34._20_4_ =
                             (local_25a0._20_4_ * auVar60._20_4_ + local_25c0._20_4_) * fVar17 *
                             fVar129;
                        auVar34._24_4_ =
                             (local_25a0._24_4_ * auVar60._24_4_ + local_25c0._24_4_) * fVar17 *
                             fVar92;
                        auVar34._28_4_ = auVar60._28_4_ + local_25c0._28_4_;
                        local_2540 = vminps_avx(auVar34,auVar111);
                        auVar96._8_4_ = 0x7f800000;
                        auVar96._0_8_ = 0x7f8000007f800000;
                        auVar96._12_4_ = 0x7f800000;
                        auVar96._16_4_ = 0x7f800000;
                        auVar96._20_4_ = 0x7f800000;
                        auVar96._24_4_ = 0x7f800000;
                        auVar96._28_4_ = 0x7f800000;
                        auVar60 = vblendmps_avx512vl(auVar96,local_2520);
                        auVar85._0_4_ =
                             (uint)(bVar36 & 1) * auVar60._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar36 >> 1 & 1);
                        auVar85._4_4_ = (uint)bVar15 * auVar60._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar36 >> 2 & 1);
                        auVar85._8_4_ = (uint)bVar15 * auVar60._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar36 >> 3 & 1);
                        auVar85._12_4_ = (uint)bVar15 * auVar60._12_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar36 >> 4 & 1);
                        auVar85._16_4_ = (uint)bVar15 * auVar60._16_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar36 >> 5 & 1);
                        auVar85._20_4_ = (uint)bVar15 * auVar60._20_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar36 >> 6 & 1);
                        auVar85._24_4_ = (uint)bVar15 * auVar60._24_4_ | (uint)!bVar15 * 0x7f800000;
                        auVar85._28_4_ =
                             (uint)(bVar36 >> 7) * auVar60._28_4_ |
                             (uint)!(bool)(bVar36 >> 7) * 0x7f800000;
                        auVar60 = vshufps_avx(auVar85,auVar85,0xb1);
                        auVar60 = vminps_avx(auVar85,auVar60);
                        auVar61 = vshufpd_avx(auVar60,auVar60,5);
                        auVar60 = vminps_avx(auVar60,auVar61);
                        auVar61 = vpermpd_avx2(auVar60,0x4e);
                        auVar60 = vminps_avx(auVar60,auVar61);
                        uVar112 = vcmpps_avx512vl(auVar85,auVar60,0);
                        bVar39 = bVar36;
                        if ((bVar36 & (byte)uVar112) != 0) {
                          bVar39 = bVar36 & (byte)uVar112;
                        }
                        uVar46 = 0;
                        for (uVar44 = (uint)bVar39; (uVar44 & 1) == 0;
                            uVar44 = uVar44 >> 1 | 0x80000000) {
                          uVar46 = uVar46 + 1;
                        }
                        uVar42 = (ulong)uVar46;
                        local_27b0 = local_27b8->args;
                        if ((local_27b0->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                          local_2660 = ZEXT432((uint)(local_27c0->super_RayK<1>).tfar);
                          pRVar14 = local_27b8->user;
                          local_2600 = local_2520;
                          do {
                            local_26a4 = *(undefined4 *)(local_2560 + uVar42 * 4);
                            local_26a0 = *(undefined4 *)(local_2540 + uVar42 * 4);
                            (ray->super_RayK<1>).tfar = local_2500[uVar42 - 8];
                            local_26b0 = local_2500[uVar42];
                            local_26ac = local_24e0[uVar42];
                            local_26a8 = local_24c0[uVar42];
                            local_269c = (int)local_2768;
                            local_2698 = (int)local_2778;
                            local_2694 = pRVar14->instID[0];
                            local_2690 = pRVar14->instPrimID[0];
                            local_276c = -1;
                            local_2710.valid = &local_276c;
                            local_2710.geometryUserPtr = pGVar11->userPtr;
                            local_2710.context = pRVar14;
                            local_2710.ray = (RTCRayN *)ray;
                            local_2710.hit = (RTCHitN *)&local_26b0;
                            local_2710.N = 1;
                            if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f39c03:
                              if ((local_27b0->filter != (RTCFilterFunctionN)0x0) &&
                                 (((local_27b0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                   != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                (*local_27b0->filter)(&local_2710);
                                auVar114 = ZEXT3264(local_2600);
                                ray = local_27c0;
                                if (*local_2710.valid == 0) goto LAB_01f39ca5;
                              }
                              (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_2710.hit;
                              (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2710.hit + 4);
                              (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2710.hit + 8);
                              *(float *)((long)local_2710.ray + 0x3c) =
                                   *(float *)(local_2710.hit + 0xc);
                              *(float *)((long)local_2710.ray + 0x40) =
                                   *(float *)(local_2710.hit + 0x10);
                              *(float *)((long)local_2710.ray + 0x44) =
                                   *(float *)(local_2710.hit + 0x14);
                              *(float *)((long)local_2710.ray + 0x48) =
                                   *(float *)(local_2710.hit + 0x18);
                              *(float *)((long)local_2710.ray + 0x4c) =
                                   *(float *)(local_2710.hit + 0x1c);
                              *(float *)((long)local_2710.ray + 0x50) =
                                   *(float *)(local_2710.hit + 0x20);
                            }
                            else {
                              (*pGVar11->intersectionFilterN)(&local_2710);
                              auVar114 = ZEXT3264(local_2600);
                              ray = local_27c0;
                              if (*local_2710.valid != 0) goto LAB_01f39c03;
LAB_01f39ca5:
                              (local_27c0->super_RayK<1>).tfar = (float)local_2660._0_4_;
                              ray = local_27c0;
                            }
                            bVar36 = ~(byte)(1 << ((uint)uVar42 & 0x1f)) & bVar36;
                            fVar105 = (ray->super_RayK<1>).tfar;
                            auVar28._4_4_ = fVar105;
                            auVar28._0_4_ = fVar105;
                            auVar28._8_4_ = fVar105;
                            auVar28._12_4_ = fVar105;
                            auVar28._16_4_ = fVar105;
                            auVar28._20_4_ = fVar105;
                            auVar28._24_4_ = fVar105;
                            auVar28._28_4_ = fVar105;
                            uVar112 = vcmpps_avx512vl(auVar114._0_32_,auVar28,2);
                            if ((bVar36 & (byte)uVar112) == 0) goto LAB_01f39a46;
                            local_2660 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                            bVar36 = bVar36 & (byte)uVar112;
                            auVar97._8_4_ = 0x7f800000;
                            auVar97._0_8_ = 0x7f8000007f800000;
                            auVar97._12_4_ = 0x7f800000;
                            auVar97._16_4_ = 0x7f800000;
                            auVar97._20_4_ = 0x7f800000;
                            auVar97._24_4_ = 0x7f800000;
                            auVar97._28_4_ = 0x7f800000;
                            auVar60 = vblendmps_avx512vl(auVar97,auVar114._0_32_);
                            auVar86._0_4_ =
                                 (uint)(bVar36 & 1) * auVar60._0_4_ |
                                 (uint)!(bool)(bVar36 & 1) * 0x7f800000;
                            bVar15 = (bool)(bVar36 >> 1 & 1);
                            auVar86._4_4_ =
                                 (uint)bVar15 * auVar60._4_4_ | (uint)!bVar15 * 0x7f800000;
                            bVar15 = (bool)(bVar36 >> 2 & 1);
                            auVar86._8_4_ =
                                 (uint)bVar15 * auVar60._8_4_ | (uint)!bVar15 * 0x7f800000;
                            bVar15 = (bool)(bVar36 >> 3 & 1);
                            auVar86._12_4_ =
                                 (uint)bVar15 * auVar60._12_4_ | (uint)!bVar15 * 0x7f800000;
                            bVar15 = (bool)(bVar36 >> 4 & 1);
                            auVar86._16_4_ =
                                 (uint)bVar15 * auVar60._16_4_ | (uint)!bVar15 * 0x7f800000;
                            bVar15 = (bool)(bVar36 >> 5 & 1);
                            auVar86._20_4_ =
                                 (uint)bVar15 * auVar60._20_4_ | (uint)!bVar15 * 0x7f800000;
                            bVar15 = (bool)(bVar36 >> 6 & 1);
                            auVar86._24_4_ =
                                 (uint)bVar15 * auVar60._24_4_ | (uint)!bVar15 * 0x7f800000;
                            auVar86._28_4_ =
                                 (uint)(bVar36 >> 7) * auVar60._28_4_ |
                                 (uint)!(bool)(bVar36 >> 7) * 0x7f800000;
                            auVar60 = vshufps_avx(auVar86,auVar86,0xb1);
                            auVar60 = vminps_avx(auVar86,auVar60);
                            auVar61 = vshufpd_avx(auVar60,auVar60,5);
                            auVar60 = vminps_avx(auVar60,auVar61);
                            auVar61 = vpermpd_avx2(auVar60,0x4e);
                            auVar60 = vminps_avx(auVar60,auVar61);
                            uVar112 = vcmpps_avx512vl(auVar86,auVar60,0);
                            bVar37 = (byte)uVar112 & bVar36;
                            bVar39 = bVar36;
                            if (bVar37 != 0) {
                              bVar39 = bVar37;
                            }
                            uVar10 = 0;
                            for (uVar40 = (uint)bVar39; (uVar40 & 1) == 0;
                                uVar40 = uVar40 >> 1 | 0x80000000) {
                              uVar10 = uVar10 + 1;
                            }
                            uVar42 = (ulong)uVar10;
                          } while( true );
                        }
                        fVar105 = *(float *)(local_2560 + uVar42 * 4);
                        fVar102 = *(float *)(local_2540 + uVar42 * 4);
                        fVar53 = local_2500[uVar42];
                        fVar87 = local_24e0[uVar42];
                        fVar88 = local_24c0[uVar42];
                        (local_27c0->super_RayK<1>).tfar = local_2500[uVar42 - 8];
                        (local_27c0->Ng).field_0.field_0.x = fVar53;
                        (local_27c0->Ng).field_0.field_0.y = fVar87;
                        (local_27c0->Ng).field_0.field_0.z = fVar88;
                        local_27c0->u = fVar105;
                        local_27c0->v = fVar102;
                        local_27c0->primID = uVar40;
                        local_27c0->geomID = uVar10;
                        pRVar14 = local_27b8->user;
                        local_27c0->instID[0] = pRVar14->instID[0];
                        local_27c0->instPrimID[0] = pRVar14->instPrimID[0];
                      }
                    }
                  }
LAB_01f39a46:
                  auVar121 = ZEXT3264(local_2400);
                  auVar124 = ZEXT3264(local_2420);
                  auVar134 = ZEXT3264(local_2460);
                  auVar136 = ZEXT3264(local_2480);
                  auVar125 = ZEXT3264(local_24a0);
                  auVar137 = ZEXT3264(local_23e0);
                  auVar60 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                  auVar138 = ZEXT3264(auVar60);
                  auVar60 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                  auVar139 = ZEXT3264(auVar60);
                  uVar42 = local_2780;
                  uVar45 = local_2788;
                  uVar47 = local_2790;
                  uVar48 = local_2798;
                  uVar49 = local_27a0;
                  uVar50 = local_27a8;
                  context = local_27b8;
                  fVar93 = local_2440;
                  fVar91 = fStack_243c;
                  fVar92 = fStack_2438;
                  fVar129 = fStack_2434;
                  fVar130 = fStack_2430;
                  fVar131 = fStack_242c;
                  fVar132 = fStack_2428;
                }
                local_2718 = local_2718 - 1 & local_2718;
              } while (local_2718 != 0);
            }
            local_2728 = local_2728 + 1;
          } while (local_2728 != local_2730);
        }
        auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
        auVar137 = ZEXT3264(auVar60);
        auVar117 = ZEXT3264(local_2680);
        auVar115 = ZEXT3264(_local_2640);
        auVar114 = ZEXT3264(_local_26e0);
        fVar105 = local_2620;
        fVar102 = fStack_261c;
        fVar53 = fStack_2618;
        fVar87 = fStack_2614;
        fVar88 = fStack_2610;
        fVar89 = fStack_260c;
        fVar90 = fStack_2608;
      }
LAB_01f39d9d:
    } while (local_27d0 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }